

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

void __thiscall EOClient::Send(EOClient *this,PacketBuilder *builder)

{
  undefined1 uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  string local_b8;
  string local_98;
  ulong local_78;
  size_t i;
  size_t mask;
  string local_58;
  undefined1 local_38 [8];
  string data;
  PacketBuilder *builder_local;
  EOClient *this_local;
  
  data.field_2._8_8_ = builder;
  PacketBuilder::operator_cast_to_string(&local_58,builder);
  PacketProcessor::Encode((string *)local_38,&this->processor,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (this->upload_fh == (FILE *)0x0) {
    PacketBuilder::operator_cast_to_string(&local_b8,(PacketBuilder *)data.field_2._8_8_);
    PacketProcessor::Encode(&local_98,&this->processor,&local_b8);
    Client::Send(&this->super_Client,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    uVar2 = std::__cxx11::string::length();
    lVar3 = std::__cxx11::string::length();
    if (lVar3 - this->send_buffer2_used < uVar2) {
      Client::Close(&this->super_Client,true);
      mask._0_4_ = 1;
      goto LAB_0015f6c4;
    }
    lVar3 = std::__cxx11::string::length();
    i = lVar3 - 1;
    local_78 = 0;
    while( true ) {
      uVar2 = local_78;
      uVar4 = std::__cxx11::string::length();
      if (uVar4 <= uVar2) break;
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_38);
      uVar1 = *puVar5;
      puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&this->send_buffer2);
      *puVar5 = uVar1;
      this->send_buffer2_ppos = this->send_buffer2_ppos + 1 & i;
      local_78 = local_78 + 1;
    }
    lVar3 = std::__cxx11::string::length();
    this->send_buffer2_used = lVar3 + this->send_buffer2_used;
  }
  mask._0_4_ = 0;
LAB_0015f6c4:
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void EOClient::Send(const PacketBuilder &builder)
{
	std::string data= this->processor.Encode(builder);

	if (this->upload_fh)
	{
		// Stick any incoming data in to our temporary buffer
		if (data.length() > this->send_buffer2.length() - this->send_buffer2_used)
		{
			this->Close(true);
			return;
		}

		const std::size_t mask = this->send_buffer2.length() - 1;

		for (std::size_t i = 0; i < data.length(); ++i)
		{
			this->send_buffer2[this->send_buffer2_ppos] = data[i];
			this->send_buffer2_ppos = (this->send_buffer2_ppos + 1) & mask;
		}

		this->send_buffer2_used += data.length();
	}
	else
	{
		Client::Send(this->processor.Encode(builder));
	}
}